

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void dec_build_inter_predictors
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,int plane,MB_MODE_INFO *mi,int build_for_obmc
               ,int bw,int bh,int mi_x,int mi_y)

{
  buf_2d *pbVar1;
  BLOCK_SIZE BVar2;
  char cVar3;
  byte bVar4;
  PREDICTION_MODE PVar5;
  ushort uVar6;
  uint uVar7;
  MB_MODE_INFO *pMVar8;
  uint8_t *dst;
  WarpedMotionParams *pWVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  RefCntBuffer *pRVar14;
  ulong uVar15;
  InterpFilterParams *pIVar16;
  long lVar17;
  byte bVar18;
  MB_MODE_INFO **ppMVar19;
  byte bVar20;
  uint uVar21;
  buf_2d *pbVar22;
  byte bVar23;
  MV MVar24;
  long lVar25;
  byte bVar26;
  long lVar27;
  uint uVar28;
  int x;
  int iVar29;
  ulong uVar30;
  int col;
  long lVar31;
  bool bVar32;
  bool bVar33;
  int local_1c8;
  char local_190;
  MV mv;
  undefined4 uStack_184;
  MV mv_1;
  WarpTypesAllowed warp_types;
  InterPredParams local_130;
  ulong local_58;
  long local_50;
  scale_factors *local_48;
  ulong local_40;
  long local_38;
  
  BVar2 = mi->bsize;
  uVar30 = (ulong)BVar2;
  uVar6 = *(ushort *)&mi->field_0xa7;
  lVar17 = (long)plane;
  if ((uVar6 >> 7 & 1) == 0 && build_for_obmc == 0) {
    iVar11 = (dcb->xd).plane[lVar17].subsampling_x;
    iVar12 = (dcb->xd).plane[lVar17].subsampling_y;
    bVar20 = (byte)(0x10003L >> (BVar2 & 0x3f));
    bVar26 = iVar11 != 0 & bVar20;
    bVar23 = (byte)(0x20005L >> (BVar2 & 0x3f));
    bVar18 = iVar12 != 0 & bVar23;
    if ((bVar26 != 0) || (bVar18 != 0)) {
      lVar13 = (long)(dcb->xd).mi_stride;
      lVar25 = -(ulong)bVar26;
      lVar27 = -(ulong)bVar18;
      ppMVar19 = (dcb->xd).mi + lVar13 * lVar27;
      bVar33 = false;
      lVar31 = lVar25;
      do {
        do {
          if (((ppMVar19[lVar31]->field_0xa7 & 0x80) != 0) ||
             (ppMVar19[lVar31]->ref_frame[0] < '\x01')) goto LAB_0016d215;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 1);
        ppMVar19 = ppMVar19 + lVar13;
        bVar33 = -1 < lVar27;
        bVar32 = lVar27 != 0;
        lVar31 = lVar25;
        lVar27 = lVar27 + 1;
      } while (bVar32);
LAB_0016d215:
      if (bVar33) {
        bVar33 = iVar11 != 0;
        bVar32 = iVar12 != 0;
        bVar18 = block_size_wide[uVar30];
        uVar28 = (uint)(block_size_high[uVar30] >> bVar32);
        cVar3 = mi->ref_frame[1];
        bVar23 = bVar23 & bVar32;
        bVar20 = bVar20 & bVar33;
        BVar2 = av1_ss_size_lookup[uVar30][bVar33][bVar32];
        bVar26 = block_size_high[BVar2];
        local_58 = (ulong)(uint)((int)(mi_y + (uint)bVar23 * -4) >> bVar32);
        local_1c8 = -(uint)bVar23;
        bVar23 = block_size_wide[BVar2];
        local_38 = (ulong)(plane != 1) * 8 + 0x510;
        local_40 = (ulong)(uint)mi_x;
        local_50 = -(ulong)bVar20;
        local_48 = cm->ref_scale_factors;
        uVar21 = 0;
        do {
          iVar11 = (int)local_58;
          uVar30 = 0;
          lVar31 = local_50;
          do {
            pMVar8 = (dcb->xd).mi[(long)local_1c8 * (long)(dcb->xd).mi_stride + lVar31];
            bVar4 = pMVar8->ref_frame[0];
            iVar12 = -1;
            if ((byte)(bVar4 - 1) < 8) {
              iVar12 = cm->remapped_ref_idx[bVar4 - 1];
            }
            if (iVar12 == -1) {
              pRVar14 = (RefCntBuffer *)0x0;
            }
            else {
              pRVar14 = cm->ref_frame_map[iVar12];
            }
            iVar12 = -1;
            if ((byte)(bVar4 - 1) < 8) {
              iVar12 = cm->remapped_ref_idx[bVar4 - 1];
            }
            iVar29 = (dcb->xd).plane[lVar17].dst.stride;
            local_130.scale_factors = (scale_factors *)0x0;
            if (iVar12 != -1) {
              local_130.scale_factors = local_48 + iVar12;
            }
            local_130.ref_frame_buf.buf0 =
                 *(uint8_t **)((long)pRVar14->ref_order_hints + local_38 + -8);
            _mv = CONCAT44(uStack_184,pMVar8->mv[0].as_int);
            local_130.subsampling_x = (dcb->xd).plane[lVar17].subsampling_x;
            local_130.subsampling_y = (dcb->xd).plane[lVar17].subsampling_y;
            local_130.bit_depth = (dcb->xd).bd;
            uVar7 = (pMVar8->interp_filters).as_int;
            local_130.block_width = (int)(bVar18 >> bVar33);
            local_130.pix_col = ((int)(mi_x + (uint)bVar20 * -4) >> bVar33) + (int)uVar30;
            local_130.use_hbd_buf = (uint)((dcb->xd).cur_buf)->flags >> 3 & 1;
            local_130.top = (0x120U >> ((byte)local_130.subsampling_y & 0x1f)) * -0x400 + 0x1000;
            local_130.left = (0x120U >> ((byte)local_130.subsampling_x & 0x1f)) * -0x400 + 0x1000;
            uVar6 = *(ushort *)&mi->field_0xa7 >> 7;
            local_130.is_intrabc = uVar6 & 1;
            local_130.mode = TRANSLATION_PRED;
            local_130.comp_mode = UNIFORM_SINGLE;
            if ((uVar6 & 1) == 0) {
              uVar15 = (ulong)(uVar7 >> 0xc & 0xff0);
              pIVar16 = (InterpFilterParams *)
                        ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar15);
              local_130.interp_filter_params[0] =
                   (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar15);
              if ((char)(uVar7 >> 0x10) == '\x04') {
                local_130.interp_filter_params[0] = pIVar16;
              }
              if (4 < (uint)local_130.block_width) {
                local_130.interp_filter_params[0] = pIVar16;
              }
              uVar15 = (ulong)((uVar7 & 0xff) << 4);
              pIVar16 = (InterpFilterParams *)
                        ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar15);
              local_130.interp_filter_params[1] =
                   (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar15);
              if ((char)uVar7 == '\x04') {
                local_130.interp_filter_params[1] = pIVar16;
              }
              if (4 < uVar28) {
                local_130.interp_filter_params[1] = pIVar16;
              }
            }
            else {
              local_130.interp_filter_params[1] = &av1_intrabc_filter_params;
              local_130.interp_filter_params[0] = &av1_intrabc_filter_params;
            }
            local_130.ref_frame_buf.buf = (uint8_t *)0x0;
            local_130.ref_frame_buf.height = (pRVar14->buf).field_3.field_0.uv_crop_height;
            local_130.ref_frame_buf.width = (pRVar14->buf).field_2.field_0.uv_crop_width;
            local_130.conv_params.round_1 =
                 ((uint)(cVar3 < '\x01') * 4 + 0x11) - local_130.bit_depth;
            if ('\0' < cVar3) {
              local_130.conv_params.round_1 = 7;
            }
            local_130.conv_params.round_0 = local_130.bit_depth + -7;
            if (local_130.bit_depth < 0xb) {
              local_130.conv_params.round_0 = 3;
            }
            local_130.ref_frame_buf.stride = (pRVar14->buf).field_4.field_0.uv_stride;
            local_130.conv_params.do_average = 0;
            local_130.conv_params.dst = (CONV_BUF_TYPE *)0x0;
            local_130.conv_params.dst_stride = 0;
            if (local_130.bit_depth < 0xb) {
              local_130.conv_params.round_1 = (uint)(cVar3 < '\x01') * 4 + 7;
            }
            local_130.conv_params.use_dist_wtd_comp_avg = 0;
            local_130.conv_params.plane = plane;
            local_130.conv_params.is_compound = (uint)('\0' < cVar3);
            local_130.block_height = uVar28;
            local_130.pix_row = iVar11 + uVar21;
            build_one_inter_predictor
                      ((dcb->xd).plane[lVar17].dst.buf + uVar30 + (long)(int)(uVar21 * iVar29),
                       iVar29,&mv,&local_130,&dcb->xd,(int)local_40 + (int)uVar30,mi_y + uVar21,0,
                       dcb->mc_buf);
            uVar30 = uVar30 + (bVar18 >> bVar33);
            lVar31 = lVar31 + 1;
          } while (uVar30 < bVar23);
          local_1c8 = local_1c8 + 1;
          uVar21 = uVar21 + uVar28;
        } while (uVar21 < bVar26);
        return;
      }
    }
  }
  cVar3 = mi->ref_frame[1];
  lVar31 = lVar17 * 0xa30;
  pbVar1 = &(dcb->xd).plane[lVar17].dst;
  dst = pbVar1->buf;
  _mv = 0;
  pWVar9 = (dcb->xd).global_motion;
  PVar5 = mi->mode;
  bVar18 = block_size_high[uVar30];
  if (block_size_wide[uVar30] < block_size_high[uVar30]) {
    bVar18 = block_size_wide[uVar30];
  }
  lVar13 = (ulong)('\0' < cVar3) + 1;
  lVar27 = 0;
  do {
    MVar24.row._0_1_ =
         (7 < bVar18 && (PVar5 - 0xf & 0xf7) == 0) && 1 < pWVar9[mi->ref_frame[lVar27]].wmtype;
    MVar24._1_3_ = 0;
    (&mv)[lVar27] = MVar24;
    lVar27 = lVar27 + 1;
  } while (lVar13 != lVar27);
  iVar11 = (dcb->xd).plane[lVar17].subsampling_x;
  iVar12 = (dcb->xd).plane[lVar17].subsampling_y;
  lVar27 = 0;
  do {
    local_190 = (char)uVar6;
    local_130.scale_factors = &cm->sf_identity;
    if (-1 < local_190) {
      local_130.scale_factors = (dcb->xd).block_ref_scale_factors[lVar27];
    }
    pbVar22 = (buf_2d *)((long)&(dcb->xd).plane[0].pre[0].buf + lVar31);
    if (local_190 < '\0') {
      pbVar22 = pbVar1;
    }
    mv_1 = *(MV *)(mi->mv + lVar27);
    warp_types.global_warp_allowed = *(int *)(&mv + lVar27);
    warp_types.local_warp_allowed = (int)(mi->motion_mode == '\x02');
    local_130.subsampling_x = (dcb->xd).plane[lVar17].subsampling_x;
    local_130.subsampling_y = (dcb->xd).plane[lVar17].subsampling_y;
    local_130.bit_depth = (dcb->xd).bd;
    local_130.use_hbd_buf = (uint)((dcb->xd).cur_buf)->flags >> 3 & 1;
    uVar21 = (mi->interp_filters).as_int;
    local_130.top = (0x120U >> ((byte)local_130.subsampling_y & 0x1f)) * -0x400 + 0x1000;
    local_130.left = (0x120U >> ((byte)local_130.subsampling_x & 0x1f)) * -0x400 + 0x1000;
    uVar10 = *(ushort *)&mi->field_0xa7 >> 7;
    local_130.is_intrabc = uVar10 & 1;
    local_130.mode = TRANSLATION_PRED;
    local_130.comp_mode = UNIFORM_SINGLE;
    if ((uVar10 & 1) == 0) {
      uVar15 = (ulong)(uVar21 >> 0xc & 0xff0);
      pIVar16 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar15);
      local_130.interp_filter_params[0] =
           (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar15);
      if ((char)(uVar21 >> 0x10) == '\x04') {
        local_130.interp_filter_params[0] = pIVar16;
      }
      if (4 < bw) {
        local_130.interp_filter_params[0] = pIVar16;
      }
      uVar15 = (ulong)((uVar21 & 0xff) << 4);
      pIVar16 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar15);
      local_130.interp_filter_params[1] =
           (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar15);
      if ((char)uVar21 == '\x04') {
        local_130.interp_filter_params[1] = pIVar16;
      }
      if (4 < bh) {
        local_130.interp_filter_params[1] = pIVar16;
      }
    }
    else {
      local_130.interp_filter_params[1] = &av1_intrabc_filter_params;
      local_130.interp_filter_params[0] = &av1_intrabc_filter_params;
    }
    local_130.ref_frame_buf.buf = pbVar22->buf;
    local_130.ref_frame_buf.buf0 = pbVar22->buf0;
    local_130.ref_frame_buf.width = pbVar22->width;
    local_130.ref_frame_buf.height = pbVar22->height;
    local_130.ref_frame_buf.stride = pbVar22->stride;
    local_130.ref_frame_buf._28_4_ = *(undefined4 *)&pbVar22->field_0x1c;
    if (cVar3 < '\x01') {
      local_130.conv_params.round_1 = 0xb;
    }
    else {
      local_130.mode = TRANSLATION_PRED;
      local_130.comp_mode = UNIFORM_COMP;
      local_130.conv_params.round_1 = 7;
    }
    local_130.conv_params.round_0 = 3;
    if ((10 < local_130.bit_depth) &&
       (local_130.conv_params.round_0 = local_130.bit_depth + -7, cVar3 < '\x01')) {
      local_130.conv_params.round_1 = (local_130.conv_params.round_1 - local_130.bit_depth) + 10;
    }
    local_130.conv_params.dst = (dcb->xd).tmp_conv_dst;
    iVar29 = (int)lVar27;
    local_130.conv_params.dst_stride = 0x80;
    local_130.conv_params.use_dist_wtd_comp_avg = 0;
    local_130.conv_params.do_average = iVar29;
    local_130.conv_params.plane = plane;
    local_130.conv_params.is_compound = (uint)('\0' < cVar3);
    local_130.block_width = bw;
    local_130.block_height = bh;
    local_130.pix_row =
         (int)(mi_y + (uint)(((0x20005UL >> (uVar30 & 0x3f) & 1) != 0 && build_for_obmc == 0) &&
                            iVar12 != 0) * -4) >> ((byte)iVar12 & 0x1f);
    local_130.pix_col =
         (int)(mi_x + (uint)(((0x10003UL >> (uVar30 & 0x3f) & 1) != 0 && build_for_obmc == 0) &&
                            iVar11 != 0) * -4) >> ((byte)iVar11 & 0x1f);
    av1_dist_wtd_comp_weight_assign
              (cm,mi,&local_130.conv_params.fwd_offset,&local_130.conv_params.bck_offset,
               &local_130.conv_params.use_dist_wtd_comp_avg,(uint)('\0' < cVar3));
    if (build_for_obmc == 0) {
      av1_init_warp_params(&local_130,&warp_types,iVar29,&dcb->xd,mi);
    }
    if (((mi->interinter_comp).type & 0xfe) == 2) {
      local_130.sb_type = mi->bsize;
      local_130.mask_comp.wedge_index = (mi->interinter_comp).wedge_index;
      local_130.mask_comp.wedge_sign = (mi->interinter_comp).wedge_sign;
      local_130.mask_comp.mask_type = (mi->interinter_comp).mask_type;
      local_130.mask_comp.type = (mi->interinter_comp).type;
      local_130.mask_comp._12_4_ = *(undefined4 *)&(mi->interinter_comp).field_0xc;
      if (lVar27 == 1) {
        local_130.conv_params.do_average = 0;
        local_130.comp_mode = MASK_COMP;
      }
      local_130.mask_comp.seg_mask = (dcb->xd).seg_mask;
    }
    build_one_inter_predictor
              (dst,(dcb->xd).plane[lVar17].dst.stride,&mv_1,&local_130,&dcb->xd,mi_x,mi_y,iVar29,
               dcb->mc_buf);
    lVar27 = lVar27 + 1;
    lVar31 = lVar31 + 0x20;
  } while (lVar13 != lVar27);
  return;
}

Assistant:

static void dec_build_inter_predictors(const AV1_COMMON *cm,
                                       DecoderCodingBlock *dcb, int plane,
                                       const MB_MODE_INFO *mi,
                                       int build_for_obmc, int bw, int bh,
                                       int mi_x, int mi_y) {
  build_inter_predictors(cm, &dcb->xd, plane, mi, build_for_obmc, bw, bh, mi_x,
                         mi_y, dcb->mc_buf);
}